

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool ON_IsOrthonormalFrame(ON_2dVector *X,ON_2dVector *Y)

{
  bool bVar1;
  double dVar2;
  double x;
  ON_2dVector *Y_local;
  ON_2dVector *X_local;
  
  bVar1 = ON_IsOrthogonalFrame(X,Y);
  if (bVar1) {
    dVar2 = ON_2dVector::Length(X);
    if (ABS(dVar2 - 1.0) <= 1.490116119385e-08) {
      dVar2 = ON_2dVector::Length(Y);
      if (ABS(dVar2 - 1.0) <= 1.490116119385e-08) {
        X_local._7_1_ = true;
      }
      else {
        X_local._7_1_ = false;
      }
    }
    else {
      X_local._7_1_ = false;
    }
  }
  else {
    X_local._7_1_ = false;
  }
  return X_local._7_1_;
}

Assistant:

bool ON_IsOrthonormalFrame( const ON_2dVector& X,  const ON_2dVector& Y )
{
  // returns true if X, Y, Z is an orthonormal frame
  if ( !ON_IsOrthogonalFrame( X, Y ) )
    return false;
  double x = X.Length();
  if ( fabs(x-1.0) >  ON_SQRT_EPSILON )
    return false;
  x = Y.Length();
  if ( fabs(x-1.0) >  ON_SQRT_EPSILON )
    return false;

  return true;
}